

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

InsertionResult * __thiscall
QHashPrivate::Data<QHashPrivate::Node<void_const*,QCss::StyleSheet>>::findOrInsert<void_const*>
          (InsertionResult *__return_storage_ptr__,
          Data<QHashPrivate::Node<void_const*,QCss::StyleSheet>> *this,void **key)

{
  long lVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  Bucket BVar5;
  Data<QHashPrivate::Node<void_const*,QCss::StyleSheet>> *local_38;
  
  uVar3 = ((*(ulong *)(this + 0x18) ^ (ulong)*key) >> 0x20 ^ *(ulong *)(this + 0x18) ^ (ulong)*key)
          * -0x2917014799a6026d;
  uVar3 = (uVar3 >> 0x20 ^ uVar3) * -0x2917014799a6026d;
  uVar3 = uVar3 >> 0x20 ^ uVar3;
  if (*(long *)(this + 0x10) == 0) {
    uVar4 = *(ulong *)(this + 8);
LAB_00374244:
    Data<QHashPrivate::Node<const_void_*,_QCss::StyleSheet>_>::rehash
              ((Data<QHashPrivate::Node<const_void_*,_QCss::StyleSheet>_> *)this,uVar4 + 1);
    BVar5 = findBucketWithHash<void_const*>(this,key,uVar3);
  }
  else {
    BVar5 = findBucketWithHash<void_const*>(this,key,uVar3);
    bVar2 = true;
    if ((BVar5.span)->offsets[BVar5.index] != 0xff) goto LAB_00374277;
    uVar4 = *(ulong *)(this + 8);
    if (*(ulong *)(this + 0x10) >> 1 <= uVar4) goto LAB_00374244;
  }
  local_38 = this + 8;
  Span<QHashPrivate::Node<const_void_*,_QCss::StyleSheet>_>::insert(BVar5.span,BVar5.index);
  *(long *)local_38 = *(long *)local_38 + 1;
  bVar2 = false;
LAB_00374277:
  lVar1 = *(long *)(this + 0x20);
  (__return_storage_ptr__->it).d = (Data<QHashPrivate::Node<const_void_*,_QCss::StyleSheet>_> *)this
  ;
  (__return_storage_ptr__->it).bucket =
       ((ulong)((long)BVar5.span - lVar1) >> 4) * 0x1c71c71c71c71c80 | BVar5.index;
  __return_storage_ptr__->initialized = bVar2;
  return __return_storage_ptr__;
}

Assistant:

InsertionResult findOrInsert(const K &key) noexcept
    {
        Bucket it(static_cast<Span *>(nullptr), 0);
        size_t hash = QHashPrivate::calculateHash(key, seed);
        if (numBuckets > 0) {
            it = findBucketWithHash(key, hash);
            if (!it.isUnused())
                return { it.toIterator(this), true };
        }
        if (shouldGrow()) {
            rehash(size + 1);
            it = findBucketWithHash(key, hash); // need to get a new iterator after rehashing
        }
        Q_ASSERT(it.span != nullptr);
        Q_ASSERT(it.isUnused());
        it.insert();
        ++size;
        return { it.toIterator(this), false };
    }